

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_rawget(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType SVar1;
  bool bVar2;
  SQObjectPtr *pSVar3;
  SQObjectPtr *key;
  SQInteger nidx;
  char *err;
  
  if (idx < 0) {
    pSVar3 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar3 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  key = SQVM::GetUp(v,-1);
  SVar1 = (pSVar3->super_SQObject)._type;
  err = "rawget works only on array/table/instance and class";
  if ((int)SVar1 < 0xa000020) {
    if (SVar1 == OT_ARRAY) {
      SVar1 = (key->super_SQObject)._type;
      if ((SVar1 >> 0x1a & 1) == 0) {
        err = "invalid index type for an array";
        goto LAB_0011348b;
      }
      if (SVar1 == OT_FLOAT) {
        nidx = (SQInteger)(key->super_SQObject)._unVal.fFloat;
      }
      else {
        nidx = (key->super_SQObject)._unVal.nInteger;
      }
      bVar2 = SQArray::Get((pSVar3->super_SQObject)._unVal.pArray,nidx,key);
    }
    else {
      if (SVar1 != OT_CLASS) goto LAB_0011348b;
      bVar2 = SQClass::Get((pSVar3->super_SQObject)._unVal.pClass,key,key);
    }
  }
  else if (SVar1 == OT_INSTANCE) {
    bVar2 = SQInstance::Get((pSVar3->super_SQObject)._unVal.pInstance,key,key);
  }
  else {
    if (SVar1 != OT_TABLE) goto LAB_0011348b;
    bVar2 = SQTable::Get((pSVar3->super_SQObject)._unVal.pTable,key,key);
  }
  if (bVar2 != false) {
    return 0;
  }
  err = "the index doesn\'t exist";
LAB_0011348b:
  SQVM::Pop(v);
  sq_throwerror(v,err);
  return -1;
}

Assistant:

SQRESULT sq_rawget(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &self=stack_get(v,idx);
    SQObjectPtr &obj = v->GetUp(-1);
    switch(type(self)) {
    case OT_TABLE:
        if(_table(self)->Get(obj,obj))
            return SQ_OK;
        break;
    case OT_CLASS:
        if(_class(self)->Get(obj,obj))
            return SQ_OK;
        break;
    case OT_INSTANCE:
        if(_instance(self)->Get(obj,obj))
            return SQ_OK;
        break;
    case OT_ARRAY:{
        if(sq_isnumeric(obj)){
            if(_array(self)->Get(tointeger(obj),obj)) {
                return SQ_OK;
            }
        }
        else {
            v->Pop();
            return sq_throwerror(v,_SC("invalid index type for an array"));
        }
                  }
        break;
    default:
        v->Pop();
        return sq_throwerror(v,_SC("rawget works only on array/table/instance and class"));
    }
    v->Pop();
    return sq_throwerror(v,_SC("the index doesn't exist"));
}